

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

double __thiscall llvm::StringError::log(StringError *this,double __x)

{
  ulong uVar1;
  raw_ostream *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_38;
  raw_ostream *local_18;
  raw_ostream *OS_local;
  StringError *this_local;
  
  OS_local = (raw_ostream *)this;
  if ((this->PrintMsgOnly & 1U) == 0) {
    local_18 = in_RSI;
    std::error_code::message_abi_cxx11_(&local_38,&this->EC);
    raw_ostream::operator<<(in_RSI,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    uVar1 = std::__cxx11::string::empty();
    dVar2 = extraout_XMM0_Qa_00;
    if ((uVar1 & 1) == 0) {
      std::operator+(&local_68," ",&this->Msg);
      raw_ostream::operator<<(local_18,&local_68);
      dVar2 = (double)std::__cxx11::string::~string((string *)&local_68);
    }
  }
  else {
    raw_ostream::operator<<(in_RSI,&this->Msg);
    dVar2 = extraout_XMM0_Qa;
  }
  return dVar2;
}

Assistant:

void StringError::log(raw_ostream &OS) const {
  if (PrintMsgOnly) {
    OS << Msg;
  } else {
    OS << EC.message();
    if (!Msg.empty())
      OS << (" " + Msg);
  }
}